

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerBreakpointManager::SourceFileLoaded
          (cmDebuggerBreakpointManager *this,string *sourcePath,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions)

{
  undefined8 uVar1;
  bool bVar2;
  mapped_type *this_00;
  mapped_type *pmVar3;
  size_type sVar4;
  reference pvVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t local_3f8;
  int64_t correctedLine;
  Source source;
  int64_t local_2b8;
  undefined1 local_2b0 [8];
  BreakpointEvent breakpointEvent;
  size_t i;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_90;
  cmDebuggerFunctionLocation local_88;
  cmListFileFunction *local_78;
  cmListFileFunction *func;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_true>
  local_50 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_true>
  local_38;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  string *sourcePath_local;
  cmDebuggerBreakpointManager *this_local;
  
  lock._8_8_ = functions;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->Mutex);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
       ::find(&this->ListFileFunctionLines,sourcePath);
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
       ::end(&this->ListFileFunctionLines);
  bVar2 = std::__detail::operator!=(&local_38,local_50);
  uVar1 = lock._8_8_;
  if (!bVar2) {
    __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                        lock._8_8_);
    func = (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                     ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)uVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                       *)&func), bVar2) {
      local_78 = __gnu_cxx::
                 __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator*(&__end1);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
                ::operator[](&this->ListFileFunctionLines,sourcePath);
      local_88.StartLine = cmListFileFunction::Line(local_78);
      local_88.EndLine = cmListFileFunction::LineEnd(local_78);
      std::
      vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
      ::emplace_back<cmDebugger::cmDebuggerFunctionLocation>(this_00,&local_88);
      __gnu_cxx::
      __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
      ::operator++(&__end1);
    }
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->ListFilePendingValidations,sourcePath);
    i = (size_t)std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->ListFilePendingValidations);
    bVar2 = std::__detail::operator==
                      (&local_90,
                       (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&i);
    if (!bVar2) {
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->ListFilePendingValidations,sourcePath);
      breakpointEvent.reason.field_2._8_8_ = 0;
      while( true ) {
        uVar1 = breakpointEvent.reason.field_2._8_8_;
        pmVar3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,sourcePath);
        sVar4 = std::
                vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                ::size(pmVar3);
        if (sVar4 <= (ulong)uVar1) break;
        dap::BreakpointEvent::BreakpointEvent((BreakpointEvent *)local_2b0);
        pmVar3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,sourcePath);
        pvVar5 = std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::operator[](pmVar3,breakpointEvent.reason.field_2._8_8_);
        local_2b8 = cmDebuggerSourceBreakpoint::GetId(pvVar5);
        dap::optional<dap::integer>::operator=
                  ((optional<dap::integer> *)&breakpointEvent.breakpoint.endLine.set,&local_2b8);
        pmVar3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,sourcePath);
        pvVar5 = std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::operator[](pmVar3,breakpointEvent.reason.field_2._8_8_);
        source.sources._24_8_ = cmDebuggerSourceBreakpoint::GetLine(pvVar5);
        dap::optional<dap::integer>::operator=
                  ((optional<dap::integer> *)&breakpointEvent.breakpoint.instructionReference.set,
                   (long *)&source.sources.set);
        memset((Source *)&correctedLine,0,0x130);
        dap::Source::Source((Source *)&correctedLine);
        dap::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&source.origin.set,sourcePath);
        dap::optional<dap::Source>::operator=
                  ((optional<dap::Source> *)&breakpointEvent.breakpoint.offset.set,
                   (Source *)&correctedLine);
        pmVar3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,sourcePath);
        pvVar5 = std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::operator[](pmVar3,breakpointEvent.reason.field_2._8_8_);
        iVar6 = cmDebuggerSourceBreakpoint::GetLine(pvVar5);
        iVar6 = CalibrateBreakpointLine(this,sourcePath,iVar6);
        local_3f8 = iVar6;
        pmVar3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                 ::operator[](&this->Breakpoints,sourcePath);
        pvVar5 = std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::operator[](pmVar3,breakpointEvent.reason.field_2._8_8_);
        iVar7 = cmDebuggerSourceBreakpoint::GetLine(pvVar5);
        if (iVar6 != iVar7) {
          pmVar3 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                   ::operator[](&this->Breakpoints,sourcePath);
          pvVar5 = std::
                   vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                   ::operator[](pmVar3,breakpointEvent.reason.field_2._8_8_);
          cmDebuggerSourceBreakpoint::ChangeLine(pvVar5,local_3f8);
        }
        std::__cxx11::string::operator=((string *)&breakpointEvent.breakpoint.verified,"changed");
        dap::boolean::operator=((boolean *)&breakpointEvent.breakpoint.source.set,0 < local_3f8);
        bVar2 = dap::boolean::operator_cast_to_bool
                          ((boolean *)&breakpointEvent.breakpoint.source.set);
        if (bVar2) {
          dap::optional<dap::integer>::operator=
                    ((optional<dap::integer> *)&breakpointEvent.breakpoint.instructionReference.set,
                     &local_3f8);
        }
        else {
          pmVar3 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
                   ::operator[](&this->Breakpoints,sourcePath);
          pvVar5 = std::
                   vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                   ::operator[](pmVar3,breakpointEvent.reason.field_2._8_8_);
          cmDebuggerSourceBreakpoint::Invalid(pvVar5);
        }
        dap::Session::send<dap::BreakpointEvent,void>(this->DapSession,(BreakpointEvent *)local_2b0)
        ;
        dap::Source::~Source((Source *)&correctedLine);
        dap::BreakpointEvent::~BreakpointEvent((BreakpointEvent *)local_2b0);
        breakpointEvent.reason.field_2._8_8_ = breakpointEvent.reason.field_2._8_8_ + 1;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

void cmDebuggerBreakpointManager::SourceFileLoaded(
  std::string const& sourcePath,
  std::vector<cmListFileFunction> const& functions)
{
  std::unique_lock<std::mutex> lock(Mutex);
  if (ListFileFunctionLines.find(sourcePath) != ListFileFunctionLines.end()) {
    // this is not expected.
    return;
  }

  for (cmListFileFunction const& func : functions) {
    ListFileFunctionLines[sourcePath].emplace_back(
      cmDebuggerFunctionLocation{ func.Line(), func.LineEnd() });
  }

  if (ListFilePendingValidations.find(sourcePath) ==
      ListFilePendingValidations.end()) {
    return;
  }

  ListFilePendingValidations.erase(sourcePath);

  for (size_t i = 0; i < Breakpoints[sourcePath].size(); i++) {
    dap::BreakpointEvent breakpointEvent;
    breakpointEvent.breakpoint.id = Breakpoints[sourcePath][i].GetId();
    breakpointEvent.breakpoint.line = Breakpoints[sourcePath][i].GetLine();
    auto source = dap::Source();
    source.path = sourcePath;
    breakpointEvent.breakpoint.source = source;
    int64_t correctedLine = CalibrateBreakpointLine(
      sourcePath, Breakpoints[sourcePath][i].GetLine());
    if (correctedLine != Breakpoints[sourcePath][i].GetLine()) {
      Breakpoints[sourcePath][i].ChangeLine(correctedLine);
    }
    breakpointEvent.reason = "changed";
    breakpointEvent.breakpoint.verified = (correctedLine > 0);
    if (breakpointEvent.breakpoint.verified) {
      breakpointEvent.breakpoint.line = correctedLine;
    } else {
      Breakpoints[sourcePath][i].Invalid();
    }

    DapSession->send(breakpointEvent);
  }
}